

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

void Gia_ManAutomWalkOne(Gia_Man_t *p,int nSteps,Vec_Wrd_t *vStates,Vec_Int_t *vCounts,
                        Vec_Wrd_t *vTemp,word Init)

{
  int iVar1;
  int iVar2;
  int local_26c;
  int local_264;
  int CountMin;
  int Count;
  int IndexMin;
  int Index;
  int kMin;
  int k;
  int i;
  word pNext [64];
  word Output;
  word iState;
  word Init_local;
  Vec_Wrd_t *vTemp_local;
  Vec_Int_t *vCounts_local;
  Vec_Wrd_t *vStates_local;
  int nSteps_local;
  Gia_Man_t *p_local;
  
  Output = 0;
  kMin = 0;
  do {
    if (nSteps <= kMin) goto LAB_009aff16;
    pNext[0x3f] = Gia_ManAutomStep(p,Output,(word *)&k,vTemp);
    IndexMin = -1;
    CountMin = -1;
    local_264 = 1000000000;
    for (Index = 0; iVar1 = Gia_ManPiNum(p), Index < iVar1; Index = Index + 1) {
      if (*(word *)(&k + (long)Index * 2) != Init) {
        iVar1 = Vec_WrdFind(vStates,*(word *)(&k + (long)Index * 2));
        if (iVar1 == -1) {
          local_26c = 0;
        }
        else {
          local_26c = Vec_IntEntry(vCounts,iVar1);
        }
        if ((local_26c < local_264) ||
           (((local_264 != 1000000000 && (local_26c != 0)) &&
            (iVar2 = rand(), (float)iVar2 / 2.1474836e+09 < (float)local_264 / (float)local_26c))))
        {
          local_264 = local_26c;
          IndexMin = Index;
          CountMin = iVar1;
        }
        if (local_264 == 0) break;
      }
    }
    if (local_264 == 1000000000) {
      for (Index = 0; iVar1 = Gia_ManPiNum(p), Index < iVar1; Index = Index + 1) {
        if ((pNext[0x3f] >> (0x3fU - (char)Index & 0x3f) & 1) != 0) {
          printf("%c",(ulong)(Index + 0x61));
          printf("!");
        }
      }
LAB_009aff16:
      printf("\n");
      return;
    }
    if (999999999 < local_264) {
      __assert_fail("CountMin < ABC_INFINITY",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaRex.c"
                    ,0x1c5,
                    "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                   );
    }
    if (CountMin == -1) {
      if (local_264 != 0) {
        __assert_fail("CountMin == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaRex.c"
                      ,0x1c8,
                      "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                     );
      }
      CountMin = Vec_IntSize(vCounts);
      Vec_IntPush(vCounts,0);
      Vec_WrdPush(vStates,*(word *)(&k + (long)IndexMin * 2));
    }
    Vec_IntAddToEntry(vCounts,CountMin,1);
    Output = *(word *)(&k + (long)IndexMin * 2);
    printf("%c",(ulong)(IndexMin + 0x61));
    if ((pNext[0x3f] >> (0x3fU - (char)IndexMin & 0x3f) & 1) != 0) {
      printf("!");
    }
    kMin = kMin + 1;
  } while( true );
}

Assistant:

void Gia_ManAutomWalkOne( Gia_Man_t * p, int nSteps, Vec_Wrd_t * vStates, Vec_Int_t * vCounts, Vec_Wrd_t * vTemp, word Init )
{
    word iState = 0, Output, pNext[64]; 
    int i, k, kMin, Index, IndexMin;
    int Count, CountMin; 
    for ( i = 0; i < nSteps; i++ )
    {
        Output = Gia_ManAutomStep( p, iState, pNext, vTemp );
        // check visited states
        kMin = -1;
        IndexMin = -1;
        CountMin = ABC_INFINITY;  
        for ( k = 0; k < Gia_ManPiNum(p); k++ )
        {
            if ( pNext[k] == Init )
                continue;
            Index = Vec_WrdFind( vStates, pNext[k] );
            Count = Index == -1 ? 0 : Vec_IntEntry( vCounts, Index );
            if ( CountMin > Count || (CountMin != ABC_INFINITY && Count && ((float)CountMin / Count) > (float)rand()/RAND_MAX ) )
            {
                CountMin = Count;
                IndexMin = Index;
                kMin = k;
            }
            if ( CountMin == 0 )
                break;
        }
        // choose the best state
        if ( CountMin == ABC_INFINITY )
        {
            for ( k = 0; k < Gia_ManPiNum(p); k++ )
                if ( (Output >> (63-k)) & 1 )
                {
                    printf( "%c", 'a' + k );
                    printf( "!" );
                }            
            break;
        }
        assert( CountMin < ABC_INFINITY );
        if ( IndexMin == -1 )
        {
            assert( CountMin == 0 );
            IndexMin = Vec_IntSize(vCounts);
            Vec_IntPush( vCounts, 0 );
            Vec_WrdPush( vStates, pNext[kMin] );
        }
        Vec_IntAddToEntry( vCounts, IndexMin, 1 );
        iState = pNext[kMin];
//Extra_PrintBinary( stdout, (unsigned *)&iState, 64 ); printf( "\n" );
        // print the transition
        printf( "%c", 'a' + kMin );
        if ( (Output >> (63-kMin)) & 1 )
            printf( "!" );
    }
    printf( "\n" );
}